

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O1

Error __thiscall
asmjit::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,uint32_t flags,uint32_t allocable,uint32_t useId,
          uint32_t useRewriteMask,uint32_t outId,uint32_t outRewriteMask,uint32_t rmSize)

{
  RARegMask *item;
  uint32_t *puVar1;
  uint *puVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  RATiedReg *pRVar5;
  BaseNode *pBVar6;
  RABlock *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Error EVar14;
  Error EVar15;
  Error EVar16;
  RABlock *pRVar17;
  long lVar18;
  undefined8 extraout_RAX;
  byte bVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar20;
  byte bVar22;
  Error EVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  InvokeNode *initialNode;
  long lVar27;
  char cVar28;
  InvokeNode *pIVar29;
  bool bVar30;
  bool bVar31;
  char cVar32;
  float __x;
  uint32_t uStack_cdc;
  Error EStack_cd8;
  undefined4 uStack_cd4;
  uint64_t uStack_cd0;
  long lStack_cc8;
  long lStack_cc0;
  RABlock *pRStack_cb8;
  ZoneVector<asmjit::RABlock_*> ZStack_cb0;
  RAInstBuilder RStack_ca0;
  RATiedReg *pRStack_68;
  RATiedReg *pRVar21;
  
  uVar26 = (workReg->_info)._signature >> 8 & 0xf;
  uVar24 = (ulong)uVar26;
  pRVar21 = workReg->_tiedReg;
  bVar19 = (byte)useId;
  if (useId == 0xff) {
LAB_00137ab9:
    bVar22 = (byte)outId;
    if (outId != 0xff) {
      if (3 < uVar26) goto LAB_00137bdc;
      puVar1 = (this->_clobbered)._masks + uVar24;
      *puVar1 = *puVar1 | 1 << (bVar22 & 0x1f);
      flags = flags | 0x2000;
    }
    this->_aggregatedFlags = this->_aggregatedFlags | flags;
    (this->_stats)._packed = (this->_stats)._packed | 1 << (sbyte)uVar26;
    if (pRVar21 != (RATiedReg *)0x0) {
      if (useId != 0xff) {
        if ((pRVar21->field_5).field_0._useId != 0xff) {
          return 0x41;
        }
        (pRVar21->field_5).field_0._useId = bVar19;
      }
      if (outId != 0xff) {
        if ((pRVar21->field_5).field_0._outId != 0xff) {
          return 0x41;
        }
        (pRVar21->field_5).field_0._outId = bVar22;
      }
      (pRVar21->field_5).field_0._refCount = (pRVar21->field_5).field_0._refCount + '\x01';
      pRVar21->_flags = pRVar21->_flags | flags;
      pRVar21->_allocableRegs = pRVar21->_allocableRegs & allocable;
      pRVar21->_useRewriteMask = pRVar21->_useRewriteMask | useRewriteMask;
      pRVar21->_outRewriteMask = pRVar21->_outRewriteMask | outRewriteMask;
      bVar19 = (pRVar21->field_5).field_0._rmSize;
      bVar22 = (byte)rmSize;
      if (rmSize < bVar19) {
        bVar22 = bVar19;
      }
      (pRVar21->field_5).field_0._rmSize = bVar22;
      return 0;
    }
    pRVar5 = this->_cur;
    uVar20 = (int)((ulong)((long)pRVar5 + (-0x38 - (long)this)) >> 3) * -0x55555555;
    pRVar21 = (RATiedReg *)(ulong)uVar20;
    if ((uVar20 & 0xffffff80) != 0) goto LAB_00137be1;
    this->_cur = pRVar5 + 1;
    pRVar21 = (RATiedReg *)(ulong)workReg->_workId;
    pRVar5->_workId = workReg->_workId;
    pRVar5->_flags = flags;
    pRVar5->_allocableRegs = allocable;
    pRVar5->_useRewriteMask = useRewriteMask;
    pRVar5->_outRewriteMask = outRewriteMask;
    (pRVar5->field_5).field_0._refCount = '\x01';
    (pRVar5->field_5).field_0._useId = bVar19;
    (pRVar5->field_5).field_0._outId = bVar22;
    (pRVar5->field_5).field_0._rmSize = (byte)rmSize;
    workReg->_tiedReg = pRVar5;
    if (3 < uVar26) goto LAB_00137be6;
    if (*(char *)((long)(this->_used)._masks + (uVar24 - 8)) != -1) {
      (this->_count).field_0._packed =
           (this->_count).field_0._packed + (1 << ((byte)(uVar26 << 3) & 0x1f));
      return 0;
    }
  }
  else {
    (this->_stats)._packed = (this->_stats)._packed | 0x100 << (sbyte)uVar26;
    if (uVar26 < 4) {
      puVar1 = (this->_used)._masks + uVar24;
      *puVar1 = *puVar1 | 1 << (bVar19 & 0x1f);
      flags = flags | 0x1000;
      goto LAB_00137ab9;
    }
    add();
LAB_00137bdc:
    add();
LAB_00137be1:
    add();
LAB_00137be6:
    add();
  }
  add();
  if (extraout_EDX == 0xff) {
    addCallArg();
LAB_00137cd5:
    addCallArg();
LAB_00137cda:
    addCallArg();
  }
  else {
    uVar26 = (workReg->_info)._signature >> 8 & 0xf;
    bVar19 = (byte)extraout_EDX;
    uVar20 = 1 << (bVar19 & 0x1f);
    this->_aggregatedFlags = this->_aggregatedFlags | 0x1101;
    if (3 < uVar26) goto LAB_00137cd5;
    puVar1 = (this->_used)._masks + uVar26;
    *puVar1 = *puVar1 | uVar20;
    (this->_stats)._packed = (this->_stats)._packed | 0x101 << (sbyte)uVar26;
    pRVar5 = workReg->_tiedReg;
    if (pRVar5 != (RATiedReg *)0x0) {
      if ((pRVar5->field_5).field_0._useId == 0xff) {
        (pRVar5->field_5).field_0._useId = bVar19;
        pRVar5->_allocableRegs = pRVar5->_allocableRegs & uVar20;
        uVar26 = 0x1101;
      }
      else {
        pRVar5->_allocableRegs = pRVar5->_allocableRegs | uVar20;
        uVar26 = 0x11101;
      }
      (pRVar5->field_5).field_0._refCount = (pRVar5->field_5).field_0._refCount + '\x01';
      pRVar5->_flags = pRVar5->_flags | uVar26;
      return 0;
    }
    pRVar5 = this->_cur;
    if (((int)((ulong)((long)pRVar5 + (-0x38 - (long)this)) >> 3) * -0x55555555 & 0xffffff80U) != 0)
    goto LAB_00137cda;
    this->_cur = pRVar5 + 1;
    pRVar5->_workId = workReg->_workId;
    pRVar5->_flags = 0x1101;
    pRVar5->_allocableRegs = uVar20;
    pRVar5->_useRewriteMask = 0;
    pRVar5->_outRewriteMask = 0;
    (pRVar5->field_5).field_0._refCount = '\x01';
    (pRVar5->field_5).field_0._useId = bVar19;
    *(undefined2 *)((long)&pRVar5->field_5 + 2) = 0xff;
    workReg->_tiedReg = pRVar5;
    if (*(char *)((long)(this->_used)._masks + ((ulong)uVar26 - 8)) != -1) {
      (this->_count).field_0._packed =
           (this->_count).field_0._packed + (1 << ((byte)(uVar26 << 3) & 0x1f));
      return 0;
    }
  }
  addCallArg();
  if (extraout_EDX_00 == 0xff) {
    addCallRet();
LAB_00137dbe:
    addCallRet();
  }
  else {
    uVar26 = (workReg->_info)._signature >> 8 & 0xf;
    bVar19 = (byte)extraout_EDX_00;
    uVar20 = 1 << (bVar19 & 0x1f);
    this->_aggregatedFlags = this->_aggregatedFlags | 0x2202;
    if (3 < uVar26) goto LAB_00137dbe;
    puVar1 = (this->_used)._masks + uVar26;
    *puVar1 = *puVar1 | uVar20;
    (this->_stats)._packed = (this->_stats)._packed | 0x101 << (sbyte)uVar26;
    pRVar5 = workReg->_tiedReg;
    if (pRVar5 != (RATiedReg *)0x0) {
      if ((pRVar5->field_5).field_0._outId == 0xff) {
        (pRVar5->field_5).field_0._refCount = (pRVar5->field_5).field_0._refCount + '\x01';
        pRVar5->_flags = pRVar5->_flags | 0x2202;
        (pRVar5->field_5).field_0._outId = bVar19;
        return 0;
      }
      return 0x41;
    }
    pRVar5 = this->_cur;
    if (((int)((ulong)((long)pRVar5 + (-0x38 - (long)this)) >> 3) * -0x55555555 & 0xffffff80U) == 0)
    {
      this->_cur = pRVar5 + 1;
      pRVar5->_workId = workReg->_workId;
      pRVar5->_flags = 0x2202;
      pRVar5->_allocableRegs = uVar20;
      pRVar5->_useRewriteMask = 0;
      pRVar5->_outRewriteMask = 0;
      *(undefined2 *)&pRVar5->field_5 = 0xff01;
      (pRVar5->field_5).field_0._outId = bVar19;
      (pRVar5->field_5).field_0._rmSize = '\0';
      workReg->_tiedReg = pRVar5;
      if (*(char *)((long)(this->_used)._masks + ((ulong)uVar26 - 8)) != -1) {
        (this->_count).field_0._packed =
             (this->_count).field_0._packed + (1 << ((byte)(uVar26 << 3) & 0x1f));
        return 0;
      }
      goto LAB_00137dc8;
    }
  }
  addCallRet();
LAB_00137dc8:
  addCallRet();
  pRStack_68 = pRVar21;
  if (*(Logger **)(this->_tiedRegs + 1) != (Logger *)0x0) {
    Logger::logf(*(Logger **)(this->_tiedRegs + 1),__x);
  }
  EVar14 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::prepare
                     ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this);
  if (EVar14 == 0) {
    lVar27._0_4_ = this->_tiedRegs[1]._workId;
    lVar27._4_4_ = this->_tiedRegs[1]._flags;
    if (lVar27 != 0) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                 *(BaseNode **)(this->_clobbered)._masks,2,(char *)0x0);
    }
    lVar12._0_4_ = this->_tiedRegs[1]._workId;
    lVar12._4_4_ = this->_tiedRegs[1]._flags;
    if (lVar12 != 0) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,*(RABlock **)(this->_used)._masks,
                 2);
    }
    pBVar6 = *(BaseNode **)(this->_clobbered)._masks;
    pIVar29 = (InvokeNode *)(pBVar6->field_0)._links[1];
    if (pIVar29 == (InvokeNode *)0x0) {
LAB_001387f7:
      EVar14 = 3;
    }
    else {
      item = &this->_used;
      pRStack_cb8 = *(RABlock **)(this->_used)._masks;
      pRStack_cb8->_first = pBVar6;
      pRStack_cb8->_last = pBVar6;
      RStack_ca0._cur = RStack_ca0._tiedRegs;
      RStack_ca0._clobbered._masks[0] = 0;
      RStack_ca0._clobbered._masks[1] = 0;
      RStack_ca0._clobbered._masks[2] = 0;
      RStack_ca0._clobbered._masks[3] = 0;
      RStack_ca0._used._masks[0] = 0;
      RStack_ca0._used._masks[1] = 0;
      RStack_ca0._used._masks[2] = 0;
      RStack_ca0._used._masks[3] = 0;
      RStack_ca0._aggregatedFlags = 0;
      RStack_ca0._forbiddenFlags = 0;
      RStack_ca0._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      RStack_ca0._stats._packed = 0;
      ZStack_cb0.super_ZoneVectorBase._data = (void *)0x0;
      ZStack_cb0.super_ZoneVectorBase._size = 0;
      ZStack_cb0.super_ZoneVectorBase._capacity = 0;
      EVar15 = EVar14;
      do {
        uVar4 = (pIVar29->super_InstNode).super_BaseNode._position;
        if (1 < uVar4 + 1) {
LAB_001387d5:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O1/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(pIVar29->super_InstNode).super_BaseNode.field_0._links[1];
        EVar16 = EVar14;
        if (((pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) != 0) {
          if (*(long *)item->_masks == 0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)pIVar29);
            cVar32 = '\x05';
            pIVar29 = initialNode;
            goto LAB_0013827c;
          }
          *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 1;
          uVar3 = (pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar3 - 0x11) < 2) {
            if (uVar4 == 0xffffffff) {
              (pIVar29->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar6 = (pIVar29->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar3 == '\x12') {
                EVar15 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,pIVar29);
              }
              else {
                EVar15 = x86::RACFGBuilder::onBeforeRet((RACFGBuilder *)this,(FuncRetNode *)pIVar29)
                ;
              }
              if (EVar15 == 0) {
                if (pBVar6 != (pIVar29->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                  if (*(InvokeNode **)(*(long *)item->_masks + 0x10) == pIVar29) {
                    *(BaseNode **)(*(long *)item->_masks + 0x10) = (pBVar6->field_0).field_0._next;
                  }
                  (pIVar29->super_InstNode).super_BaseNode._position = 0xffffffff;
                  pIVar29 = (InvokeNode *)(pBVar6->field_0)._links[1];
                  if ((*(byte *)((long)&pIVar29->super_InstNode + 0x11) & 0x20) == 0)
                  goto LAB_001387f2;
                }
                initialNode = (InvokeNode *)
                              ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pIVar29->super_InstNode)
                              ->_links[1];
                bVar31 = true;
                EVar15 = EVar14;
              }
              else {
                bVar31 = false;
              }
              cVar32 = '\x01';
              EVar16 = EVar15;
              if (!bVar31) goto LAB_0013827c;
            }
          }
          lVar9._0_4_ = this->_tiedRegs[1]._workId;
          lVar9._4_4_ = this->_tiedRegs[1]._flags;
          if (lVar9 != 0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)pIVar29,4,
                       (char *)0x0);
          }
          uStack_cdc = 0;
          RStack_ca0._aggregatedFlags = 0;
          RStack_ca0._forbiddenFlags = 0;
          RStack_ca0._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          RStack_ca0._stats._packed = 0;
          RStack_ca0._used._masks[0] = 0;
          RStack_ca0._used._masks[1] = 0;
          RStack_ca0._used._masks[2] = 0;
          RStack_ca0._used._masks[3] = 0;
          RStack_ca0._clobbered._masks[0] = 0;
          RStack_ca0._clobbered._masks[1] = 0;
          RStack_ca0._clobbered._masks[2] = 0;
          RStack_ca0._clobbered._masks[3] = 0;
          RStack_ca0._cur = RStack_ca0._tiedRegs;
          EVar14 = x86::RACFGBuilder::onInst
                             ((RACFGBuilder *)this,&pIVar29->super_InstNode,&uStack_cdc,&RStack_ca0)
          ;
          cVar28 = '\x01';
          cVar32 = cVar28;
          if ((EVar14 == 0) &&
             (((pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType != '\x12' ||
              (EVar14 = x86::RACFGBuilder::onInvoke((RACFGBuilder *)this,pIVar29,&RStack_ca0),
              EVar14 == 0)))) {
            if ((pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x11') {
              EVar14 = x86::RACFGBuilder::onRet
                                 ((RACFGBuilder *)this,(FuncRetNode *)pIVar29,&RStack_ca0);
              if (EVar14 != 0) goto LAB_0013819e;
              uStack_cdc = 4;
            }
            if ((uStack_cdc == 1) && (RStack_ca0._tiedRegs != RStack_ca0._cur)) {
              lVar27 = *(long *)this;
              lVar12 = *(long *)(this->_used)._masks;
              pRVar21 = RStack_ca0._tiedRegs;
              uVar24 = 0;
              do {
                if (*(uint *)(lVar27 + 0x148) <= pRVar21->_workId) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_001387d5;
                }
                uVar25 = uVar24;
                if ((*(byte *)(*(long *)(*(long *)(lVar27 + 0x140) + (ulong)pRVar21->_workId * 8) +
                              0x21) & 0xf) == 0) {
                  bVar19 = (pRVar21->field_5).field_0._useId;
                  if (bVar19 == 0xff) {
                    uVar25 = (ulong)((int)uVar24 + 1);
                    bVar19 = *(byte *)(lVar27 + 0x114 + uVar24);
                    (pRVar21->field_5).field_0._useId = bVar19;
                  }
                  puVar2 = (uint *)(lVar12 + 0xc0);
                  *puVar2 = *puVar2 | 1 << (bVar19 & 0x1f);
                }
                pRVar21 = pRVar21 + 1;
                uVar24 = uVar25;
              } while (pRVar21 != RStack_ca0._cur);
            }
            EVar14 = BaseRAPass::assignRAInst
                               (*(BaseRAPass **)this,(BaseNode *)pIVar29,
                                *(RABlock **)(this->_used)._masks,&RStack_ca0);
            uVar4 = uStack_cdc;
            if (EVar14 == 0) {
              uVar26 = (this->_clobbered)._masks[2] | RStack_ca0._stats._packed;
              (this->_clobbered)._masks[2] = uVar26;
              if (uStack_cdc != 0) {
                if (uStack_cdc < 3) {
                  lVar27 = *(long *)item->_masks;
                  *(InvokeNode **)(lVar27 + 0x18) = pIVar29;
                  uVar20 = *(uint *)(lVar27 + 0xc);
                  *(uint *)(lVar27 + 0xc) = uVar20 | 0x101;
                  *(uint *)(lVar27 + 0x30) = *(uint *)(lVar27 + 0x30) | uVar26;
                  if (((pIVar29->super_InstNode)._baseInst._options & 2) == 0) {
                    bVar19 = (pIVar29->super_InstNode).super_BaseNode.field_1._any._reserved0;
                    if (bVar19 == 0) {
                      cVar32 = '\x01';
                      EVar15 = 3;
                    }
                    else {
                      uVar26 = bVar19 - 1;
                      if (((pIVar29->super_InstNode)._opArray[uVar26]._signature & 7) == 4) {
                        EVar14 = BaseBuilder::labelNodeOf
                                           (*(BaseBuilder **)&this->_count,(LabelNode **)&EStack_cd8
                                            ,(pIVar29->super_InstNode)._opArray[uVar26]._baseId);
                        if (EVar14 == 0) {
                          bVar31 = false;
                          pRVar17 = BaseRAPass::newBlockOrExistingAt
                                              (*(BaseRAPass **)this,
                                               (LabelNode *)CONCAT44(uStack_cd4,EStack_cd8),
                                               (BaseNode **)0x0);
                          if (pRVar17 == (RABlock *)0x0) {
                            EVar14 = 1;
                          }
                          else {
                            *(byte *)&pRVar17->_flags = (byte)pRVar17->_flags | 4;
                            EVar16 = RABlock::appendSuccessor(*(RABlock **)item->_masks,pRVar17);
                            bVar31 = EVar16 == 0;
                            EVar14 = EVar15;
                            if (!bVar31) {
                              EVar14 = EVar16;
                            }
                          }
                        }
                        else {
                          bVar31 = false;
                        }
                        cVar32 = '\x01';
                        EVar15 = EVar14;
                        if (bVar31) {
LAB_001385cb:
                          cVar32 = '\0';
                          EVar15 = EVar14;
                        }
                      }
                      else {
                        *(uint *)(lVar27 + 0xc) = uVar20 | 0x501;
                        if ((pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType ==
                            '\x0f') {
                          lVar18._0_1_ = (pIVar29->_funcDetail)._callConv._id;
                          lVar18._1_1_ = (pIVar29->_funcDetail)._callConv._arch;
                          lVar18._2_1_ = (pIVar29->_funcDetail)._callConv._strategy;
                          lVar18._3_1_ = (pIVar29->_funcDetail)._callConv._redZoneSize;
                          lVar18._4_1_ = (pIVar29->_funcDetail)._callConv._spillZoneSize;
                          lVar18._5_1_ = (pIVar29->_funcDetail)._callConv._naturalStackAlignment;
                          lVar18._6_2_ = (pIVar29->_funcDetail)._callConv._flags;
                        }
                        else {
                          lVar18 = 0;
                        }
                        lVar27 = *(long *)this;
                        if (lVar18 == 0) {
                          EVar14 = ZoneVector<asmjit::RABlock_*>::append
                                             (&ZStack_cb0,(ZoneAllocator *)(lVar27 + 0x18),
                                              (RABlock **)item);
                          cVar32 = '\x01';
                          if (EVar14 == 0) goto LAB_001385c5;
                        }
                        else {
                          uStack_cd0 = *(long *)(lVar27 + 0xf8) + 1;
                          *(uint64_t *)(lVar27 + 0xf8) = uStack_cd0;
                          bVar31 = (ulong)*(uint *)(lVar18 + 0x18) == 0;
                          if (!bVar31) {
                            lStack_cc0 = *(long *)(lVar18 + 0x10);
                            lStack_cc8 = (ulong)*(uint *)(lVar18 + 0x18) << 2;
                            lVar27 = 0;
                            do {
                              EVar14 = BaseBuilder::labelNodeOf
                                                 (*(BaseBuilder **)&this->_count,
                                                  (LabelNode **)&EStack_cd8,
                                                  *(uint32_t *)(lStack_cc0 + lVar27));
                              if (EVar14 == 0) {
                                pRVar17 = BaseRAPass::newBlockOrExistingAt
                                                    (*(BaseRAPass **)this,
                                                     (LabelNode *)CONCAT44(uStack_cd4,EStack_cd8),
                                                     (BaseNode **)0x0);
                                if (pRVar17 == (RABlock *)0x0) {
                                  EVar14 = 1;
                                  goto LAB_001384a7;
                                }
                                bVar30 = true;
                                if (pRVar17->_timestamp != uStack_cd0) {
                                  pRVar17->_timestamp = uStack_cd0;
                                  *(byte *)&pRVar17->_flags = (byte)pRVar17->_flags | 4;
                                  EVar14 = RABlock::appendSuccessor
                                                     (*(RABlock **)item->_masks,pRVar17);
                                  bVar30 = EVar14 == 0;
                                  if (!bVar30) {
                                    EVar15 = EVar14;
                                  }
                                }
                              }
                              else {
LAB_001384a7:
                                bVar30 = false;
                                EVar15 = EVar14;
                              }
                              if (!bVar30) {
                                cVar32 = '\x01';
                                goto LAB_001385a0;
                              }
                              lVar27 = lVar27 + 4;
                              bVar31 = lStack_cc8 == lVar27;
                            } while (!bVar31);
                          }
                          cVar32 = '\x1c';
LAB_001385a0:
                          EVar14 = EVar15;
                          if (bVar31) {
                            EVar15 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::
                                     shareAssignmentAcrossSuccessors
                                               ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                                                *(RABlock **)(this->_used)._masks);
                            cVar32 = EVar15 != 0;
                            if ((bool)cVar32) {
                              EVar14 = EVar15;
                            }
                          }
                          EVar15 = EVar14;
                          if (cVar32 == '\0') {
LAB_001385c5:
                            EVar14 = EVar15;
                            cVar32 = '\0';
                          }
                        }
                        EVar15 = EVar14;
                        if (cVar32 == '\0') goto LAB_001385cb;
                      }
                    }
                    EVar14 = EVar15;
                    if (cVar32 != '\0') goto LAB_0013819e;
                  }
                  if (uVar4 != 1) {
                    pIVar29 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar14 = 3;
                      cVar32 = cVar28;
                      goto LAB_0013819e;
                    }
                    if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                         ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode +
                         1))->_any)._nodeType == '\x03') {
                      pRVar17 = *(RABlock **)
                                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)
                                  &initialNode->super_InstNode)[2].field_0;
                      if (pRVar17 == (RABlock *)0x0) {
                        pRVar17 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)initialNode)
                        ;
                        if (pRVar17 == (RABlock *)0x0) goto LAB_00138769;
                        *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0 = pRVar17;
                      }
                    }
                    else {
                      pRVar17 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)initialNode);
                      if (pRVar17 == (RABlock *)0x0) {
LAB_00138769:
                        EVar14 = 1;
                        cVar32 = '\x01';
                        goto LAB_0013819e;
                      }
                    }
                    pRVar7 = *(RABlock **)item->_masks;
                    puVar1 = &pRVar7->_flags;
                    *puVar1 = *puVar1 | 0x200;
                    EVar14 = RABlock::prependSuccessor(pRVar7,pRVar17);
                    cVar32 = cVar28;
                    if (EVar14 == 0) {
                      *(RABlock **)(this->_used)._masks = pRVar17;
                      *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
                      (this->_clobbered)._masks[2] = 0;
                      if ((pRVar17->_flags & 1) == 0) {
                        EVar14 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar17);
                        if ((EVar14 == 0) &&
                           (lVar13._0_4_ = this->_tiedRegs[1]._workId,
                           lVar13._4_4_ = this->_tiedRegs[1]._flags, EVar14 = EVar15,
                           cVar32 = '\x05', lVar13 != 0)) {
                          RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                                    ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                                     *(RABlock **)(this->_used)._masks,2);
                        }
                      }
                      else {
                        EVar14 = EVar15;
                        cVar32 = '\x04';
                      }
                    }
                    goto LAB_0013819e;
                  }
                  item->_masks[0] = 0;
                  item->_masks[1] = 0;
                }
                if (uVar4 == 4) {
                  pRVar17 = *(RABlock **)(this->_used)._masks;
                  pRVar17->_last = (BaseNode *)pIVar29;
                  *(byte *)&pRVar17->_flags = (byte)pRVar17->_flags | 1;
                  (pRVar17->_regsStats)._packed =
                       (pRVar17->_regsStats)._packed | (this->_clobbered)._masks[2];
                  EVar14 = RABlock::appendSuccessor(pRVar17,*(RABlock **)((this->_used)._masks + 2))
                  ;
                  cVar32 = cVar28;
                  if (EVar14 != 0) goto LAB_0013819e;
                  item->_masks[0] = 0;
                  item->_masks[1] = 0;
                }
              }
              EVar14 = EVar15;
              cVar32 = '\0';
            }
          }
LAB_0013819e:
          EVar16 = EVar14;
          EVar15 = EVar14;
          if (cVar32 != '\0') goto LAB_0013827c;
          goto LAB_0013826d;
        }
        if ((pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x03') {
          pRVar17 = *(RABlock **)item->_masks;
          pRVar7 = (RABlock *)(pIVar29->super_InstNode).super_BaseNode._passData;
          if (pRVar17 != (RABlock *)0x0) {
            if (pRVar7 == (RABlock *)0x0) {
              if ((byte)(pRVar17 == pRStack_cb8 | (byte)this->_tiedRegs[0]._allocableRegs) == 1) {
                if ((InvokeNode *)pRVar17->_last == pIVar29) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar17->_last = (pIVar29->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar17->_flags = pRVar17->_flags | 0x201;
                (pRVar17->_regsStats)._packed =
                     (pRVar17->_regsStats)._packed | (this->_clobbered)._masks[2];
                pRVar17 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)pIVar29);
                cVar32 = '\x01';
                if (pRVar17 == (RABlock *)0x0) {
                  bVar31 = false;
                  EVar14 = 1;
                }
                else {
                  *(byte *)&pRVar17->_flags = (byte)pRVar17->_flags | 4;
                  EVar15 = RABlock::appendSuccessor(*(RABlock **)item->_masks,pRVar17);
                  if ((EVar15 == 0) &&
                     (EVar15 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar17), EVar15 == 0)) {
                    *(RABlock **)(this->_used)._masks = pRVar17;
                    *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
                    (this->_clobbered)._masks[2] = 0;
                    bVar31 = true;
                  }
                  else {
                    bVar31 = false;
                    EVar14 = EVar15;
                  }
                }
                EVar16 = EVar14;
                EVar15 = EVar14;
                if (!bVar31) goto LAB_0013827c;
              }
              (pIVar29->super_InstNode).super_BaseNode._passData = *(void **)item->_masks;
              EVar23 = EVar15;
            }
            else {
              *(byte *)&pRVar7->_flags = (byte)pRVar7->_flags | 4;
              if (pRVar17 == pRVar7) {
                bVar31 = true;
                if ((char)this->_tiedRegs[0]._allocableRegs == '\x01') {
                  EVar15 = 3;
LAB_00137f23:
                  EVar14 = EVar15;
                  bVar31 = false;
                  EVar15 = EVar14;
                }
              }
              else {
                if ((InvokeNode *)pRVar17->_last == pIVar29) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
LAB_001387f2:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_001387f7;
                }
                pRVar17->_last = (pIVar29->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar17->_flags = pRVar17->_flags | 0x201;
                (pRVar17->_regsStats)._packed =
                     (pRVar17->_regsStats)._packed | (this->_clobbered)._masks[2];
                EVar15 = RABlock::appendSuccessor(pRVar17,pRVar7);
                if ((EVar15 != 0) ||
                   (EVar15 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar7), EVar15 != 0))
                goto LAB_00137f23;
                *(RABlock **)(this->_used)._masks = pRVar7;
                *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
                (this->_clobbered)._masks[2] = 0;
                bVar31 = true;
                EVar15 = EVar14;
              }
              cVar32 = '\x01';
              EVar16 = EVar14;
              EVar23 = EVar15;
              if (!bVar31) goto LAB_0013827c;
            }
LAB_00138224:
            pRVar17 = *(RABlock **)(this->_used)._masks;
            if (((pRVar17 != (RABlock *)0x0) &&
                (pRVar17 != *(RABlock **)&this->_tiedRegs[0]._outRewriteMask)) &&
               (lVar10._0_4_ = this->_tiedRegs[1]._workId, lVar10._4_4_ = this->_tiedRegs[1]._flags,
               lVar10 != 0)) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,pRVar17,2);
            }
            lVar11._0_4_ = this->_tiedRegs[1]._workId;
            lVar11._4_4_ = this->_tiedRegs[1]._flags;
            if (lVar11 != 0) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)pIVar29,2,
                         (char *)0x0);
            }
            EVar15 = EVar23;
            if ((pIVar29->super_InstNode)._baseInst._id == (this->_clobbered)._masks[3]) {
              pRVar17 = *(RABlock **)(this->_used)._masks;
              pRVar17->_last = (BaseNode *)pIVar29;
              *(byte *)&pRVar17->_flags = (byte)pRVar17->_flags | 1;
              (pRVar17->_regsStats)._packed =
                   (pRVar17->_regsStats)._packed | (this->_clobbered)._masks[2];
              EVar15 = BaseRAPass::addExitBlock(*(BaseRAPass **)this,pRVar17);
              cVar32 = '\x01';
              EVar16 = EVar15;
              if (EVar15 != 0) goto LAB_0013827c;
              item->_masks[0] = 0;
              item->_masks[1] = 0;
              EVar15 = EVar14;
            }
            goto LAB_0013826d;
          }
          *(RABlock **)item->_masks = pRVar7;
          if (pRVar7 == (RABlock *)0x0) {
            pRVar17 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)pIVar29);
            *(RABlock **)(this->_used)._masks = pRVar17;
            if (pRVar17 != (RABlock *)0x0) {
              (pIVar29->super_InstNode).super_BaseNode._passData = pRVar17;
              goto LAB_001381ed;
            }
            cVar32 = '\x01';
            EVar16 = 1;
            EVar15 = 1;
          }
          else {
            cVar32 = '\x04';
            if ((pRVar7->_flags & 1) == 0) {
LAB_001381ed:
              pRVar17 = *(RABlock **)(this->_used)._masks;
              puVar1 = &pRVar17->_flags;
              *puVar1 = *puVar1 | 4;
              *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
              (this->_clobbered)._masks[2] = 0;
              EVar15 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar17);
              cVar32 = '\x01';
              EVar16 = EVar15;
              EVar23 = EVar14;
              if (EVar15 == 0) goto LAB_00138224;
            }
          }
        }
        else {
          lVar8._0_4_ = this->_tiedRegs[1]._workId;
          lVar8._4_4_ = this->_tiedRegs[1]._flags;
          if (lVar8 != 0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)pIVar29,4,
                       (char *)0x0);
          }
          uVar3 = (pIVar29->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar3 == '\n') {
            if (pIVar29 == *(InvokeNode **)(*(long *)(this->_clobbered)._masks + 0x238)) {
              cVar32 = '\x04';
              if (*(long *)item->_masks == 0) goto LAB_0013827c;
LAB_00137fc5:
              cVar32 = '\x01';
              EVar16 = 3;
              EVar15 = 3;
              goto LAB_0013827c;
            }
          }
          else if ((uVar3 == '\x10') && (pIVar29 != *(InvokeNode **)(this->_clobbered)._masks))
          goto LAB_00137fc5;
LAB_0013826d:
          cVar32 = '\0';
          pIVar29 = initialNode;
          EVar16 = EVar14;
          if (initialNode == (InvokeNode *)0x0) {
            EVar15 = 3;
            cVar32 = '\x01';
            EVar16 = 3;
          }
        }
LAB_0013827c:
        EVar14 = EVar16;
      } while ((cVar32 == '\0') || (cVar32 == '\x05'));
      if ((cVar32 == '\x04') &&
         (EVar14 = 3, *(int *)(*(long *)this + 0xe4) == *(int *)(*(long *)this + 0xb8))) {
        RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
        EVar14 = EStack_cd8;
      }
    }
  }
  return EVar14;
}

Assistant:

Error add(RAWorkReg* workReg, uint32_t flags, uint32_t allocable, uint32_t useId, uint32_t useRewriteMask, uint32_t outId, uint32_t outRewriteMask, uint32_t rmSize = 0) noexcept {
    uint32_t group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedReg::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedReg::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, allocable, useId, useRewriteMask, outId, outRewriteMask, rmSize);
      workReg->setTiedReg(tiedReg);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_allocableRegs &= allocable;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }